

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericDatum.cc
# Opt level: O1

void __thiscall avro::GenericRecord::GenericRecord(GenericRecord *this,NodePtr *schema)

{
  pointer pGVar1;
  long *plVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar4;
  size_t i;
  ulong uVar5;
  GenericDatum local_40;
  
  GenericContainer::GenericContainer(&this->super_GenericContainer,AVRO_RECORD,schema);
  (this->fields_).super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fields_).super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->fields_).super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar3 = (*schema->px->_vptr_Node[4])();
  std::vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>::resize
            (&this->fields_,CONCAT44(extraout_var,iVar3));
  lVar4 = 8;
  uVar5 = 0;
  while( true ) {
    iVar3 = (*schema->px->_vptr_Node[4])();
    if (CONCAT44(extraout_var_00,iVar3) <= uVar5) break;
    iVar3 = (*schema->px->_vptr_Node[5])(schema->px,uVar5 & 0xffffffff);
    GenericDatum::GenericDatum(&local_40,(NodePtr *)CONCAT44(extraout_var_01,iVar3));
    pGVar1 = (this->fields_).
             super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>._M_impl.
             super__Vector_impl_data._M_start;
    *(Type *)((long)pGVar1 + lVar4 + -8) = local_40.type_;
    plVar2 = *(long **)((long)&pGVar1->type_ + lVar4);
    *(placeholder **)((long)&pGVar1->type_ + lVar4) = local_40.value_.content;
    local_40.value_.content = (placeholder *)0x0;
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
    if (local_40.value_.content != (placeholder *)0x0) {
      (*(local_40.value_.content)->_vptr_placeholder[1])();
    }
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + 0x10;
  }
  return;
}

Assistant:

GenericRecord::GenericRecord(const NodePtr& schema) :
    GenericContainer(AVRO_RECORD, schema) {
    fields_.resize(schema->leaves());
    for (size_t i = 0; i < schema->leaves(); ++i) {
        fields_[i] = GenericDatum(schema->leafAt(i));
    }
}